

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventStream.cpp
# Opt level: O2

ostream * binlog::operator<<(ostream *out,ClockSync *a)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"ClockSync{");
  poVar1 = std::operator<<(poVar1,"clockValue: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"clockFrequency: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"nsSinceEpoch: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"tzOffset: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,a->tzOffset);
  poVar1 = std::operator<<(poVar1,"tzName: ");
  poVar1 = std::operator<<(poVar1,(string *)&a->tzName);
  poVar1 = std::operator<<(poVar1," }");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ClockSync& a)
{
  return
  out << "ClockSync{"
      << "clockValue: " << a.clockValue
      << "clockFrequency: " << a.clockFrequency
      << "nsSinceEpoch: " << a.nsSinceEpoch
      << "tzOffset: " << a.tzOffset
      << "tzName: " << a.tzName << " }";
}